

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
AnalyzeShortFunctionDefinition
          (ExpressionContext *ctx,SynShortFunctionDefinition *syntax,TypeBase *type,
          ArrayView<ArgumentData> currArguments,IntrusiveList<MatchData> aliases)

{
  uint *this;
  TypeHandle *pTVar1;
  TypeBase *pTVar2;
  TypeFunction *argumentType;
  ExprBase *pEVar3;
  long lVar4;
  ulong uVar5;
  uint index;
  uint uVar6;
  TypeBase **ppTVar7;
  
  if (type != (TypeBase *)0x0) {
    uVar6 = 0;
    if (type->typeID != 0x15) {
      return (ExprBase *)0x0;
    }
    index = currArguments.count;
    lVar4._0_4_ = type[1].typeID;
    lVar4._4_4_ = type[1].nameHash;
    if (lVar4 != 0) {
      uVar6 = 0;
      do {
        uVar6 = uVar6 + 1;
        lVar4 = *(long *)(lVar4 + 8);
      } while (lVar4 != 0);
    }
    if (index + 1 <= uVar6) {
      this = &type[1].typeID;
      if (type->isGeneric == true) {
        if (index != 0) {
          ppTVar7 = &(currArguments.data)->type;
          uVar5 = 0;
          do {
            pTVar1 = IntrusiveList<TypeHandle>::operator[]
                               ((IntrusiveList<TypeHandle> *)this,(uint)uVar5);
            pTVar2 = MatchGenericType(ctx,&syntax->super_SynBase,pTVar1->type,*ppTVar7,&aliases,
                                      false);
            if (pTVar2 == (TypeBase *)0x0) {
              return (ExprBase *)0x0;
            }
            uVar5 = uVar5 + 1;
            ppTVar7 = ppTVar7 + 6;
          } while (index != uVar5);
        }
        pTVar1 = IntrusiveList<TypeHandle>::operator[]((IntrusiveList<TypeHandle> *)this,index);
        argumentType = (TypeFunction *)
                       ResolveGenericTypeAliases(ctx,&syntax->super_SynBase,pTVar1->type,aliases);
      }
      else {
        pTVar1 = IntrusiveList<TypeHandle>::operator[]((IntrusiveList<TypeHandle> *)this,index);
        argumentType = (TypeFunction *)pTVar1->type;
      }
      if ((argumentType != (TypeFunction *)0x0) && ((argumentType->super_TypeBase).typeID == 0x15))
      {
        pEVar3 = AnalyzeShortFunctionDefinition(ctx,syntax,(FunctionData *)0x0,argumentType);
        return pEVar3;
      }
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

void ExpressionContext::PushScope(ScopeType type)
{
	ScopeData *next = new (get<ScopeData>()) ScopeData(allocator, scope, uniqueScopeId++, type);

	if(scope)
	{
		scope->scopes.push_back(next);

		next->startOffset = scope->dataSize;
	}

	scope = next;

	if(lookupLocation)
		scope->unrestricted = true;
}